

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::RegisterTests
          (ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest> *this)

{
  code *pcVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  reference ptr;
  pointer pIVar6;
  ulong uVar7;
  TestInfo *pTVar8;
  Scenario *pSVar9;
  ostream *poVar10;
  void *pvVar11;
  size_type sVar12;
  Message *pMVar13;
  char *test_case_name_00;
  char *name;
  char *value_param;
  undefined4 extraout_var;
  TestMetaFactoryBase<gurkenlaeufer::Scenario> *pTVar14;
  undefined4 extraout_var_00;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar15;
  Scenario local_258;
  CodeLocation local_208;
  string local_1e0;
  string local_1c0;
  _Base_ptr local_1a0;
  undefined1 local_198;
  GTestLog local_190;
  GTestLog local_18c;
  TestParamInfo<gurkenlaeufer::Scenario> local_188;
  undefined1 local_130 [8];
  string param_name;
  Message test_name_stream;
  undefined1 local_100 [8];
  iterator param_it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  size_t i;
  string local_a0 [8];
  string test_case_name;
  int line;
  char *file;
  undefined1 *name_func;
  undefined1 local_58 [8];
  ParamGenerator<gurkenlaeufer::Scenario> generator;
  string *instantiation_name;
  __normal_iterator<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo>_>_>
  local_38;
  iterator gen_it;
  linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>
  test_info;
  __normal_iterator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>_>_>_>
  local_18;
  iterator test_it;
  ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest> *this_local;
  
  test_it._M_current =
       (linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>
        *)this;
  local_18._M_current =
       (linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>
        *)std::
          vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>_>_>
          ::begin(&this->tests_);
  while( true ) {
    test_info.link_.next_ =
         (linked_ptr_internal *)
         std::
         vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>_>_>
         ::end(&this->tests_);
    bVar3 = __gnu_cxx::operator!=
                      (&local_18,
                       (__normal_iterator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>_>_>_>
                        *)&test_info.link_);
    if (!bVar3) break;
    ptr = __gnu_cxx::
          __normal_iterator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>_>_>_>
          ::operator*(&local_18);
    linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>
    ::linked_ptr((linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>
                  *)&gen_it,ptr);
    local_38._M_current =
         (InstantiationInfo *)
         std::
         vector<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo>_>
         ::begin(&this->instantiations_);
    while( true ) {
      instantiation_name =
           (string *)
           std::
           vector<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo>_>
           ::end(&this->instantiations_);
      bVar3 = __gnu_cxx::operator!=
                        (&local_38,
                         (__normal_iterator<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo>_>_>
                          *)&instantiation_name);
      if (!bVar3) break;
      generator.impl_.link_.next_ =
           (linked_ptr_internal *)
           __gnu_cxx::
           __normal_iterator<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo>_>_>
           ::operator->(&local_38);
      pIVar6 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo>_>_>
               ::operator->(&local_38);
      (*pIVar6->generator)(local_58);
      pIVar6 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo>_>_>
               ::operator->(&local_38);
      pcVar1 = (code *)pIVar6->name_func;
      pIVar6 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo>_>_>
               ::operator->(&local_38);
      pcVar2 = pIVar6->file;
      pIVar6 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo>_>_>
               ::operator->(&local_38);
      test_case_name.field_2._12_4_ = pIVar6->line;
      std::__cxx11::string::string(local_a0);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       generator.impl_.link_.next_,"/");
        std::__cxx11::string::operator=(local_a0,(string *)&i);
        std::__cxx11::string::~string((string *)&i);
      }
      pTVar8 = linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>
               ::operator->((linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>
                             *)&gen_it);
      std::__cxx11::string::operator+=(local_a0,(string *)pTVar8);
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&param_it);
      ParamGenerator<gurkenlaeufer::Scenario>::begin
                ((ParamGenerator<gurkenlaeufer::Scenario> *)local_100);
      while( true ) {
        ParamGenerator<gurkenlaeufer::Scenario>::end
                  ((ParamGenerator<gurkenlaeufer::Scenario> *)&test_name_stream);
        bVar3 = ParamIterator<gurkenlaeufer::Scenario>::operator!=
                          ((ParamIterator<gurkenlaeufer::Scenario> *)local_100,
                           (ParamIterator<gurkenlaeufer::Scenario> *)&test_name_stream);
        ParamIterator<gurkenlaeufer::Scenario>::~ParamIterator
                  ((ParamIterator<gurkenlaeufer::Scenario> *)&test_name_stream);
        if (!bVar3) break;
        Message::Message((Message *)((long)&param_name.field_2 + 8));
        pSVar9 = ParamIterator<gurkenlaeufer::Scenario>::operator*
                           ((ParamIterator<gurkenlaeufer::Scenario> *)local_100);
        TestParamInfo<gurkenlaeufer::Scenario>::TestParamInfo
                  (&local_188,pSVar9,
                   test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
        (*pcVar1)(local_130,&local_188);
        TestParamInfo<gurkenlaeufer::Scenario>::~TestParamInfo(&local_188);
        bVar3 = IsValidParamName((string *)local_130);
        bVar3 = IsTrue(bVar3);
        if (!bVar3) {
          GTestLog::GTestLog(&local_18c,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/paulelsner[P]gurkenlaeufer/gtest/include/gtest/gtest.h"
                             ,0x2d61);
          poVar10 = GTestLog::GetStream(&local_18c);
          poVar10 = std::operator<<(poVar10,"Condition IsValidParamName(param_name) failed. ");
          poVar10 = std::operator<<(poVar10,"Parameterized test name \'");
          poVar10 = std::operator<<(poVar10,(string *)local_130);
          poVar10 = std::operator<<(poVar10,"\' is invalid, in ");
          poVar10 = std::operator<<(poVar10,pcVar2);
          poVar10 = std::operator<<(poVar10," line ");
          pvVar11 = (void *)std::ostream::operator<<(poVar10,test_case_name.field_2._12_4_);
          std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
          GTestLog::~GTestLog(&local_18c);
        }
        sVar12 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&param_it,(key_type *)local_130);
        bVar3 = IsTrue(sVar12 == 0);
        if (!bVar3) {
          GTestLog::GTestLog(&local_190,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/paulelsner[P]gurkenlaeufer/gtest/include/gtest/gtest.h"
                             ,0x2d66);
          poVar10 = GTestLog::GetStream(&local_190);
          poVar10 = std::operator<<(poVar10,
                                    "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar10 = std::operator<<(poVar10,"Duplicate parameterized test name \'");
          poVar10 = std::operator<<(poVar10,(string *)local_130);
          poVar10 = std::operator<<(poVar10,"\', in ");
          poVar10 = std::operator<<(poVar10,pcVar2);
          poVar10 = std::operator<<(poVar10," line ");
          pvVar11 = (void *)std::ostream::operator<<(poVar10,test_case_name.field_2._12_4_);
          std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
          GTestLog::~GTestLog(&local_190);
        }
        pVar15 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&param_it,(value_type *)local_130);
        local_1a0 = (_Base_ptr)pVar15.first._M_node;
        local_198 = pVar15.second;
        pTVar8 = linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>
                 ::operator->((linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>
                               *)&gen_it);
        pMVar13 = Message::operator<<((Message *)((long)&param_name.field_2 + 8),
                                      &pTVar8->test_base_name);
        pMVar13 = Message::operator<<(pMVar13,(char (*) [2])0x25e360);
        Message::operator<<(pMVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_130);
        test_case_name_00 = (char *)std::__cxx11::string::c_str();
        Message::GetString_abi_cxx11_(&local_1c0,(Message *)((long)&param_name.field_2 + 8));
        name = (char *)std::__cxx11::string::c_str();
        pSVar9 = ParamIterator<gurkenlaeufer::Scenario>::operator*
                           ((ParamIterator<gurkenlaeufer::Scenario> *)local_100);
        PrintToString<gurkenlaeufer::Scenario>(&local_1e0,pSVar9);
        value_param = (char *)std::__cxx11::string::c_str();
        CodeLocation::CodeLocation(&local_208,&this->code_location_);
        iVar4 = (*(this->super_ParameterizedTestCaseInfoBase)._vptr_ParameterizedTestCaseInfoBase[3]
                )();
        pTVar8 = linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>
                 ::operator->((linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>
                               *)&gen_it);
        pTVar14 = scoped_ptr<testing::internal::TestMetaFactoryBase<gurkenlaeufer::Scenario>_>::
                  operator->(&pTVar8->test_meta_factory);
        pSVar9 = ParamIterator<gurkenlaeufer::Scenario>::operator*
                           ((ParamIterator<gurkenlaeufer::Scenario> *)local_100);
        gurkenlaeufer::Scenario::Scenario(&local_258,pSVar9);
        iVar5 = (*pTVar14->_vptr_TestMetaFactoryBase[2])(pTVar14,&local_258);
        MakeAndRegisterTestInfo
                  (test_case_name_00,name,(char *)0x0,value_param,&local_208,
                   (TypeId)CONCAT44(extraout_var,iVar4),Test::SetUpTestCase,Test::TearDownTestCase,
                   (TestFactoryBase *)CONCAT44(extraout_var_00,iVar5));
        gurkenlaeufer::Scenario::~Scenario(&local_258);
        CodeLocation::~CodeLocation(&local_208);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)local_130);
        Message::~Message((Message *)((long)&param_name.field_2 + 8));
        ParamIterator<gurkenlaeufer::Scenario>::operator++
                  ((ParamIterator<gurkenlaeufer::Scenario> *)local_100);
        test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count =
             test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
      }
      ParamIterator<gurkenlaeufer::Scenario>::~ParamIterator
                ((ParamIterator<gurkenlaeufer::Scenario> *)local_100);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&param_it);
      std::__cxx11::string::~string(local_a0);
      ParamGenerator<gurkenlaeufer::Scenario>::~ParamGenerator
                ((ParamGenerator<gurkenlaeufer::Scenario> *)local_58);
      __gnu_cxx::
      __normal_iterator<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::InstantiationInfo>_>_>
      ::operator++(&local_38);
    }
    linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>
    ::~linked_ptr((linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>
                   *)&gen_it);
    __gnu_cxx::
    __normal_iterator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<gurkenlaeufer::detail::CucumberTest>::TestInfo>_>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

virtual void RegisterTests() {
    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      linked_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin(); gen_it != instantiations_.end();
               ++gen_it) {
        const string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        string test_case_name;
        if ( !instantiation_name.empty() )
          test_case_name = instantiation_name + "/";
        test_case_name += test_info->test_case_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          Message test_name_stream;

          std::string param_name = name_func(
              TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file
              << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name
              << "', in " << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          test_name_stream << test_info->test_base_name << "/" << param_name;
          MakeAndRegisterTestInfo(
              test_case_name.c_str(),
              test_name_stream.GetString().c_str(),
              NULL,  // No type parameter.
              PrintToString(*param_it).c_str(),
              code_location_,
              GetTestCaseTypeId(),
              TestCase::SetUpTestCase,
              TestCase::TearDownTestCase,
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }  // for gen_it
    }  // for test_it
  }